

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlp_util.cc
# Opt level: O2

CtrlPMatchMode cpsm::parse_ctrlp_match_mode(string_ref mmode)

{
  bool bVar1;
  Error *this;
  char *in_RCX;
  CtrlPMatchMode CVar2;
  boost *this_00;
  basic_string_ref<char,_std::char_traits<char>_> x;
  basic_string_ref<char,_std::char_traits<char>_> x_00;
  basic_string_ref<char,_std::char_traits<char>_> x_01;
  basic_string_ref<char,_std::char_traits<char>_> x_02;
  
  x.ptr_ = (char *)mmode.len_;
  this_00 = (boost *)mmode.ptr_;
  CVar2 = FULL_LINE;
  if ((x.ptr_ != (char *)0x0) &&
     (x.len_ = (size_t)"full-line", bVar1 = boost::operator==(this_00,x,in_RCX), !bVar1)) {
    x_00.len_ = (size_t)"filename-only";
    x_00.ptr_ = x.ptr_;
    bVar1 = boost::operator==(this_00,x_00,in_RCX);
    if (bVar1) {
      CVar2 = FILENAME_ONLY;
    }
    else {
      x_01.len_ = (size_t)"first-non-tab";
      x_01.ptr_ = x.ptr_;
      bVar1 = boost::operator==(this_00,x_01,in_RCX);
      if (bVar1) {
        CVar2 = FIRST_NON_TAB;
      }
      else {
        x_02.len_ = (size_t)"until-last-tab";
        x_02.ptr_ = x.ptr_;
        bVar1 = boost::operator==(this_00,x_02,in_RCX);
        if (!bVar1) {
          this = (Error *)__cxa_allocate_exception(0x28);
          Error::Error<char_const*,boost::basic_string_ref<char,std::char_traits<char>>>
                    (this,"unknown match mode ",mmode);
          __cxa_throw(this,&Error::typeinfo,Error::~Error);
        }
        CVar2 = UNTIL_LAST_TAB;
      }
    }
  }
  return CVar2;
}

Assistant:

CtrlPMatchMode parse_ctrlp_match_mode(boost::string_ref const mmode) {
  if (mmode.empty() || mmode == "full-line") {
    return CtrlPMatchMode::FULL_LINE;
  } else if (mmode == "filename-only") {
    return CtrlPMatchMode::FILENAME_ONLY;
  } else if (mmode == "first-non-tab") {
    return CtrlPMatchMode::FIRST_NON_TAB;
  } else if (mmode == "until-last-tab") {
    return CtrlPMatchMode::UNTIL_LAST_TAB;
  }
  throw Error("unknown match mode ", mmode);
}